

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileio.c
# Opt level: O1

void ffstat(FILE *ffp,buffer *bp)

{
  int iVar1;
  undefined1 local_a0 [8];
  stat sb;
  
  if (bp != (buffer *)0x0) {
    iVar1 = fileno((FILE *)ffp);
    iVar1 = fstat(iVar1,(stat *)local_a0);
    if (iVar1 == 0) {
      (bp->b_fi).fi_mode = (uint)sb.st_nlink | 0x8000;
      (bp->b_fi).fi_uid = sb.st_nlink._4_4_;
      (bp->b_fi).fi_gid = sb.st_mode;
      (bp->b_fi).fi_mtime.tv_sec = sb.st_atim.tv_nsec;
      (bp->b_fi).fi_mtime.tv_nsec = sb.st_mtim.tv_sec;
      bp->b_flag = bp->b_flag & 0x9f;
    }
  }
  return;
}

Assistant:

void
ffstat(FILE *ffp, struct buffer *bp)
{
	struct stat	sb;

	if (bp && fstat(fileno(ffp), &sb) == 0) {
		/* set highorder bit to make sure this isn't all zero */
		bp->b_fi.fi_mode = sb.st_mode | 0x8000;
		bp->b_fi.fi_uid = sb.st_uid;
		bp->b_fi.fi_gid = sb.st_gid;
		bp->b_fi.fi_mtime = sb.st_mtim;
		/* Clear the ignore flag */
		bp->b_flag &= ~(BFIGNDIRTY | BFDIRTY);
	}
}